

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rough_plastic.hpp
# Opt level: O3

Color __thiscall RoughPlasticBSDF::f(RoughPlasticBSDF *this,Color *albedo,vec3f *wo,vec3f *wi)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  float fVar29;
  float fVar30;
  Color CVar31;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  
  fVar21 = ABS(wo->z);
  fVar14 = *(float *)&(this->super_BSDF).field_0x24;
  fVar15 = 1.0 - fVar21 * fVar21;
  if (fVar15 <= 0.0) {
    fVar15 = 0.0;
  }
  fVar16 = SQRT(fVar15) / fVar14;
  fVar15 = 1.0;
  if (fVar16 < 1.0) {
    fVar15 = 1.0 - fVar16 * fVar16;
    if (fVar15 < 0.0) {
      fVar15 = sqrtf(fVar15);
    }
    else {
      fVar15 = SQRT(fVar15);
    }
    fVar16 = (fVar14 * fVar21 - fVar15) / (fVar14 * fVar21 + fVar15);
    fVar14 = (fVar21 - fVar14 * fVar15) / (fVar14 * fVar15 + fVar21);
    fVar15 = (fVar14 * fVar14 + fVar16 * fVar16) * 0.5;
  }
  fVar14 = 1.0 - wi->z * wi->z;
  if (fVar14 < 0.0) {
    fVar14 = sqrtf(fVar14);
  }
  else {
    fVar14 = SQRT(fVar14);
  }
  fVar21 = 0.0;
  fVar14 = fVar14 / *(float *)&(this->super_BSDF).field_0x24;
  local_d8 = 0;
  if (fVar14 < 1.0) {
    fVar14 = 1.0 - fVar14 * fVar14;
    if (fVar14 < 0.0) {
      fVar14 = sqrtf(fVar14);
    }
    else {
      fVar14 = SQRT(fVar14);
    }
    fVar21 = *(float *)&(this->super_BSDF).field_0x24;
    fVar24 = 1.0 / fVar21;
    fVar16 = 1.0 - fVar14 * fVar14;
    if (fVar16 <= 0.0) {
      fVar16 = 0.0;
    }
    fVar17 = SQRT(fVar16) / fVar24;
    fVar16 = 1.0;
    if (fVar17 < 1.0) {
      fVar21 = 1.0 - fVar17 * fVar17;
      if (fVar21 < 0.0) {
        local_e8._4_12_ = (undefined1  [12])0x0;
        fVar21 = sqrtf(fVar21);
      }
      else {
        fVar21 = SQRT(fVar21);
      }
      fVar16 = (fVar24 * fVar14 - fVar21) / (fVar24 * fVar14 + fVar21);
      fVar14 = (fVar14 - fVar24 * fVar21) / (fVar24 * fVar21 + fVar14);
      fVar16 = (fVar14 * fVar14 + fVar16 * fVar16) * 0.5;
      fVar21 = *(float *)&(this->super_BSDF).field_0x24;
    }
    fVar24 = PI;
    auVar22._0_4_ = (1.0 - fVar15) * (1.0 - fVar16);
    fVar25 = 1.0 / (fVar21 * fVar21);
    fVar17 = 1.0 - this->outRatio;
    fVar14 = albedo->z;
    uVar1 = albedo->x;
    uVar7 = albedo->y;
    auVar22._4_4_ = auVar22._0_4_;
    auVar22._8_4_ = auVar22._0_4_;
    auVar22._12_4_ = auVar22._0_4_;
    auVar23._4_4_ = 1.0 - fVar17 * (float)uVar7;
    auVar23._0_4_ = 1.0 - fVar17 * (float)uVar1;
    auVar23._8_4_ = 0.0 - fVar17 * 0.0;
    auVar23._12_4_ = 0.0 - fVar17 * 0.0;
    auVar23 = divps(auVar22,auVar23);
    fVar15 = wo->z;
    local_e8._0_4_ = wi->z;
    fVar29 = fVar15 + wi->z;
    uVar2 = wo->x;
    uVar8 = wo->y;
    uVar3 = wi->x;
    uVar9 = wi->y;
    fVar18 = (float)uVar3 + (float)uVar2;
    fVar16 = (float)uVar9 + (float)uVar8;
    fVar26 = 1.0 / SQRT(fVar29 * fVar29 + fVar18 * fVar18 + fVar16 * fVar16);
    fVar29 = fVar29 * fVar26;
    fVar18 = fVar26 * fVar18;
    fVar26 = fVar26 * fVar16;
    fVar19 = fVar29 * fVar15 + (float)uVar8 * fVar26 + fVar18 * (float)uVar2;
    fVar16 = 1.0 - fVar19 * fVar19;
    if (fVar16 <= 0.0) {
      fVar16 = 0.0;
    }
    fVar16 = SQRT(fVar16) / fVar21;
    fVar27 = 1.0;
    if (fVar16 < 1.0) {
      fVar15 = 1.0 - fVar16 * fVar16;
      if (fVar15 < 0.0) {
        fVar15 = sqrtf(fVar15);
        local_e8 = auVar23;
      }
      else {
        fVar15 = SQRT(fVar15);
      }
      fVar16 = (fVar21 * fVar19 - fVar15) / (fVar21 * fVar19 + fVar15);
      fVar15 = (fVar19 - fVar21 * fVar15) / (fVar21 * fVar15 + fVar19);
      fVar27 = (fVar15 * fVar15 + fVar16 * fVar16) * 0.5;
      fVar15 = wo->z;
      local_e8._0_4_ = wi->z;
    }
    auVar28._0_4_ = fVar25 * auVar23._0_4_;
    auVar28._4_4_ = fVar25 * auVar23._4_4_;
    auVar28._8_4_ = fVar25 * auVar23._8_4_;
    auVar28._12_4_ = fVar25 * auVar23._12_4_;
    fVar21 = this->alpha;
    fVar16 = -fVar29;
    fVar19 = fVar29 * fVar29;
    fVar19 = fVar21 / ((fVar21 * fVar21 +
                       (float)(-(uint)(0.0 < 1.0 - fVar19) & (uint)((1.0 - fVar19) / fVar19))) *
                      fVar19);
    if (fVar29 < fVar16) {
      fVar18 = -fVar18;
      fVar26 = -fVar26;
    }
    auVar13._4_4_ = fVar24;
    auVar13._0_4_ = fVar24;
    auVar13._8_4_ = fVar24;
    auVar13._12_4_ = fVar24;
    auVar23 = divps(auVar28,auVar13);
    fVar20 = 1.0 / PI;
    uVar4 = wi->x;
    uVar10 = wi->y;
    if (fVar16 <= fVar29) {
      fVar16 = fVar29;
    }
    fVar29 = 1.0 - fVar15 * fVar15;
    fVar30 = 1.0;
    if (0.0 < fVar29) {
      uVar5 = wo->x;
      uVar11 = wo->y;
      if (fVar29 < 0.0) {
        fVar29 = sqrtf(fVar29);
      }
      else {
        fVar29 = SQRT(fVar29);
      }
      fVar29 = fVar29 / fVar15;
      fVar30 = 1.0;
      if (((fVar29 != 0.0) || (NAN(fVar29))) &&
         (fVar30 = 0.0,
         0.0 < (fVar15 * fVar16 + (float)uVar5 * fVar18 + fVar26 * (float)uVar11) * fVar15)) {
        fVar30 = 2.0 / (SQRT(ABS(fVar29) * fVar21 * ABS(fVar29) * fVar21 + 1.0) + 1.0);
      }
    }
    fVar29 = 1.0;
    fVar15 = 1.0 - (float)local_e8._0_4_ * (float)local_e8._0_4_;
    if (0.0 < fVar15) {
      if (fVar15 < 0.0) {
        fVar15 = sqrtf(fVar15);
      }
      else {
        fVar15 = SQRT(fVar15);
      }
      fVar29 = 1.0;
      fVar15 = fVar15 / (float)local_e8._0_4_;
      if (((fVar15 != 0.0) || (NAN(fVar15))) &&
         (fVar29 = 0.0,
         0.0 < (fVar16 * (float)local_e8._0_4_ + (float)uVar4 * fVar18 + fVar26 * (float)uVar10) *
               (float)local_e8._0_4_)) {
        fVar29 = 2.0 / (SQRT(fVar21 * ABS(fVar15) * fVar21 * ABS(fVar15) + 1.0) + 1.0);
      }
    }
    fVar27 = fVar27 * ((fVar20 * fVar19 * fVar19 * fVar30 * fVar29) / (wo->z * 4.0 * wi->z));
    fVar21 = fVar14 * ((fVar25 * (auVar22._0_4_ / (1.0 - fVar17 * fVar14))) / fVar24) +
             (this->Ks).z * fVar27;
    uVar6 = (this->Ks).x;
    uVar12 = (this->Ks).y;
    local_d8 = CONCAT44((float)uVar7 * auVar23._4_4_ + fVar27 * (float)uVar12,
                        (float)uVar1 * auVar23._0_4_ + fVar27 * (float)uVar6);
  }
  CVar31.z = fVar21;
  CVar31.x = (float)(undefined4)local_d8;
  CVar31.y = (float)local_d8._4_4_;
  return CVar31;
}

Assistant:

Color f(const Color& albedo, const vec3f& wo, const vec3f& wi) const
	{
		float energy = 1;
		energy *= 1 - DielectricBRDF::reflectivity(fabs(wo.z), IOR);
		float sint = sqrtf(1-wi.z*wi.z)/IOR;
		if (sint >= 1) return 0; // total reflect (shouldn't happen if IOR>1)
		float cost = sqrtf(1-sint*sint);
		energy *= 1 - DielectricBRDF::reflectivity(cost, 1/IOR);
		float ratio2 = 1/(IOR*IOR); // see note_refract_radiance
		vec3f diff = energy / (1 - albedo * (1-outRatio)) * ratio2 * 1/PI * albedo;
		// add reflect component
		vec3f wm = normalized(wo+wi); // microfacet normal
		float cos = dot(wm,wo);
		Color Fres = DielectricBRDF::reflectivity(cos, IOR); // reflected energy
		vec3f refl = EDX::GGX_D(wm,alpha) * EDX::Smith_G(wo,wi,wm,alpha) / (4 * wo.z * wi.z) * Fres;
		// console.log(refl, diff);
		return refl * Ks + diff;
	}